

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O0

int32_t __thiscall cppnet::BufferQueue::MoveWritePt(BufferQueue *this,int32_t len)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  bool local_72;
  bool local_61;
  undefined1 local_58 [32];
  undefined1 local_38 [32];
  int local_18;
  int32_t local_14;
  int32_t total_write_len;
  int32_t len_local;
  BufferQueue *this_local;
  
  local_18 = 0;
  local_14 = len;
  _total_write_len = this;
  if (len < 0) {
    while (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->_buffer_write),
          bVar1) {
      peVar3 = std::
               __shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->_buffer_write);
      iVar2 = (*(peVar3->super_InnerBuffer).super_Buffer._vptr_Buffer[0xe])
                        (peVar3,(ulong)(uint)(local_14 + local_18));
      local_18 = iVar2 + local_18;
      List<cppnet::BufferBlock>::GetHead((List<cppnet::BufferBlock> *)(local_58 + 0x10));
      local_72 = std::operator==(&this->_buffer_write,
                                 (shared_ptr<cppnet::BufferBlock> *)(local_58 + 0x10));
      local_72 = local_72 || -local_14 <= local_18;
      std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                ((shared_ptr<cppnet::BufferBlock> *)(local_58 + 0x10));
      if (local_72) break;
      std::__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&this->_buffer_write);
      ListSlot<cppnet::BufferBlock>::GetPrev((ListSlot<cppnet::BufferBlock> *)local_58);
      std::shared_ptr<cppnet::BufferBlock>::operator=
                (&this->_buffer_write,(shared_ptr<cppnet::BufferBlock> *)local_58);
      std::shared_ptr<cppnet::BufferBlock>::~shared_ptr((shared_ptr<cppnet::BufferBlock> *)local_58)
      ;
    }
  }
  else {
    while (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->_buffer_write),
          bVar1) {
      peVar3 = std::
               __shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->_buffer_write);
      iVar2 = (*(peVar3->super_InnerBuffer).super_Buffer._vptr_Buffer[0xe])
                        (peVar3,(ulong)(uint)(local_14 - local_18));
      local_18 = iVar2 + local_18;
      List<cppnet::BufferBlock>::GetTail((List<cppnet::BufferBlock> *)(local_38 + 0x10));
      local_61 = std::operator==(&this->_buffer_write,
                                 (shared_ptr<cppnet::BufferBlock> *)(local_38 + 0x10));
      local_61 = local_61 || local_14 <= local_18;
      std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                ((shared_ptr<cppnet::BufferBlock> *)(local_38 + 0x10));
      if (local_61) break;
      std::__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&this->_buffer_write);
      ListSlot<cppnet::BufferBlock>::GetNext((ListSlot<cppnet::BufferBlock> *)local_38);
      std::shared_ptr<cppnet::BufferBlock>::operator=
                (&this->_buffer_write,(shared_ptr<cppnet::BufferBlock> *)local_38);
      std::shared_ptr<cppnet::BufferBlock>::~shared_ptr((shared_ptr<cppnet::BufferBlock> *)local_38)
      ;
    }
  }
  this->_can_read_length = local_18 + this->_can_read_length;
  return local_18;
}

Assistant:

int32_t BufferQueue::MoveWritePt(int32_t len) {
    int32_t total_write_len = 0;
    if (len >= 0) {
        while (_buffer_write) {
            total_write_len += _buffer_write->MoveWritePt(len - total_write_len);
            if (_buffer_write == _buffer_list.GetTail() || len <= total_write_len) {
                break;
            }
            _buffer_write = _buffer_write->GetNext();
        }

    } else {
        while (_buffer_write) {
            total_write_len += _buffer_write->MoveWritePt(len + total_write_len);
            if (_buffer_write == _buffer_list.GetHead() || -len <= total_write_len) {
                break;
            }
            _buffer_write = _buffer_write->GetPrev();
        }
    }
    _can_read_length += total_write_len;
    return total_write_len;
}